

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O0

void anon_unknown.dwarf_10db0::cmakemainProgressCallback(string *m,float prog,cmake *cm)

{
  bool bVar1;
  string *psVar2;
  ulong uVar3;
  ostream *poVar4;
  cmake *cm_00;
  string local_e8;
  char local_c1;
  string local_c0;
  string_view local_a0;
  char local_89;
  string local_88;
  string_view local_58;
  string local_48 [8];
  string dir;
  cmMakefile *mf;
  cmake *cm_local;
  float prog_local;
  string *m_local;
  
  dir.field_2._8_8_ = cmakemainGetMakefile(cm);
  std::__cxx11::string::string(local_48);
  if (dir.field_2._8_8_ == 0) {
LAB_00196699:
    if (dir.field_2._8_8_ != 0) {
      local_a0 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)m);
      bVar1 = cmHasLiteralPrefix<11ul>(local_a0,(char (*) [11])"Generating");
      if (bVar1) {
        local_c1 = ' ';
        psVar2 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((cmMakefile *)dir.field_2._8_8_);
        cmStrCat<char,std::__cxx11::string_const&>(&local_c0,&local_c1,psVar2);
        std::__cxx11::string::operator=(local_48,(string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
      }
    }
  }
  else {
    local_58 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)m);
    bVar1 = cmHasLiteralPrefix<12ul>(local_58,(char (*) [12])"Configuring");
    if ((!bVar1) || (0.0 <= prog)) goto LAB_00196699;
    local_89 = ' ';
    psVar2 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((cmMakefile *)dir.field_2._8_8_);
    cmStrCat<char,std::__cxx11::string_const&>(&local_88,&local_89,psVar2);
    std::__cxx11::string::operator=(local_48,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  if (0.0 <= prog) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) goto LAB_0019680f;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"-- ");
  poVar4 = std::operator<<(poVar4,(string *)m);
  poVar4 = std::operator<<(poVar4,local_48);
  (anonymous_namespace)::cmakemainGetStack_abi_cxx11_(&local_e8,(_anonymous_namespace_ *)cm,cm_00);
  poVar4 = std::operator<<(poVar4,(string *)&local_e8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_e8);
LAB_0019680f:
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void cmakemainProgressCallback(const std::string& m, float prog, cmake* cm)
{
  cmMakefile* mf = cmakemainGetMakefile(cm);
  std::string dir;
  if (mf && cmHasLiteralPrefix(m, "Configuring") && (prog < 0)) {
    dir = cmStrCat(' ', mf->GetCurrentSourceDirectory());
  } else if (mf && cmHasLiteralPrefix(m, "Generating")) {
    dir = cmStrCat(' ', mf->GetCurrentBinaryDirectory());
  }

  if ((prog < 0) || (!dir.empty())) {
    std::cout << "-- " << m << dir << cmakemainGetStack(cm) << std::endl;
  }
}